

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall piksel::Graphics::scale(Graphics *this,float x,float y)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar5;
  _Elt_pointer pSVar6;
  
  psVar5 = this->stateStack;
  pSVar6 = (psVar5->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar6 == (psVar5->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar6 = (psVar5->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  uVar1 = *(undefined8 *)&pSVar6[-1].shaderRelevantState.modelMatrix.value[0].field_0;
  uVar2 = *(undefined8 *)((long)&pSVar6[-1].shaderRelevantState.modelMatrix.value[0].field_0 + 8);
  uVar3 = *(undefined8 *)&pSVar6[-1].shaderRelevantState.modelMatrix.value[1].field_0;
  uVar4 = *(undefined8 *)((long)&pSVar6[-1].shaderRelevantState.modelMatrix.value[1].field_0 + 8);
  pSVar6[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.x = (float)uVar1 * x;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.y =
       (float)((ulong)uVar1 >> 0x20) * x;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.z = (float)uVar2 * x;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.w =
       (float)((ulong)uVar2 >> 0x20) * x;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.x = (float)uVar3 * y;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.y =
       (float)((ulong)uVar3 >> 0x20) * y;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.z = y * (float)uVar4;
  pSVar6[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.w =
       y * (float)((ulong)uVar4 >> 0x20);
  return;
}

Assistant:

State& Graphics::peek() {
    return stateStack.top();
}